

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256_sse41.cpp
# Opt level: O0

__m128i sha256d64_sse41::anon_unknown_0::Read4(uchar *chunk,int offset)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  long in_FS_OFFSET;
  __m128i alVar8;
  __m128i ret;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = ReadLE32((uchar *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  uVar5 = ReadLE32((uchar *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  uVar6 = ReadLE32((uchar *)CONCAT44(in_stack_ffffffffffffff64,uVar5));
  uVar7 = ReadLE32((uchar *)CONCAT44(uVar6,uVar5));
  auVar3._4_4_ = uVar6;
  auVar3._0_4_ = uVar7;
  auVar3._12_4_ = uVar4;
  auVar3._8_4_ = uVar5;
  auVar2._8_8_ = 0xc0d0e0f08090a0b;
  auVar2._0_8_ = 0x405060700010203;
  pshufb(auVar3,auVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    alVar8[1]._0_4_ = 0x4050607;
    alVar8[0] = *(long *)(in_FS_OFFSET + 0x28);
    alVar8[1]._4_4_ = 0;
    return alVar8;
  }
  __stack_chk_fail();
}

Assistant:

__m128i inline Read4(const unsigned char* chunk, int offset) {
    __m128i ret = _mm_set_epi32(
        ReadLE32(chunk + 0 + offset),
        ReadLE32(chunk + 64 + offset),
        ReadLE32(chunk + 128 + offset),
        ReadLE32(chunk + 192 + offset)
    );
    return _mm_shuffle_epi8(ret, _mm_set_epi32(0x0C0D0E0FUL, 0x08090A0BUL, 0x04050607UL, 0x00010203UL));
}